

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O2

string * __thiscall
LSM_tree::get_level_name_abi_cxx11_(string *__return_storage_ptr__,LSM_tree *this,int level_id)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,level_id);
  std::operator+(__return_storage_ptr__,"DATA\\",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string LSM_tree::get_level_name(int level_id) {
    std::string ans="DATA\\"+to_string(level_id);
    return ans;
}